

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestMutualRecursionA::_InternalSerialize
          (TestMutualRecursionA *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestMutualRecursionB *value;
  bool bVar1;
  int cached_size;
  uint uVar2;
  uint32_t *puVar3;
  uint8_t *puVar4;
  RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR> *this_00;
  const_reference value_00;
  UnknownFieldSet *unknown_fields;
  uint local_30;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  TestMutualRecursionA *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestMutualRecursionA *this_local;
  
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar2 = *puVar3;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar2 & 1) != 0) {
    value = (this->field_0)._impl_.bb_;
    cached_size = TestMutualRecursionB::GetCachedSize((this->field_0)._impl_.bb_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (1,(MessageLite *)value,cached_size,target,stream);
  }
  if ((uVar2 & 2) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteGroup
                             (2,(MessageLite *)(this->field_0)._impl_.subgroup_,puVar4,stream);
  }
  local_30 = 0;
  uVar2 = _internal_subgroupr_size(this);
  for (; local_30 < uVar2; local_30 = local_30 + 1) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    this_00 = _internal_subgroupr(this);
    value_00 = google::protobuf::RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR>::
               Get(this_00,local_30);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteGroup
                             (5,(MessageLite *)value_00,puVar4,stream);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMutualRecursionA::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMutualRecursionA& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestMutualRecursionA)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_unittest.TestMutualRecursionB bb = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.bb_, this_._impl_.bb_->GetCachedSize(), target,
        stream);
  }

  // .proto2_unittest.TestMutualRecursionA.SubGroup subgroup = 2 [features = {
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
        2, *this_._impl_.subgroup_, target, stream);
  }

  // repeated .proto2_unittest.TestMutualRecursionA.SubGroupR subgroupr = 5 [features = {
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_subgroupr_size());
       i < n; i++) {
    target = stream->EnsureSpace(target);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
            5, this_._internal_subgroupr().Get(i),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestMutualRecursionA)
  return target;
}